

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O0

void HCP(uint8_t *sigH,uint16_t *challengeC,uint16_t *challengeP,commitments_t *Ch,uint8_t *hCv,
        uint8_t *salt,uint8_t *pubKey,uint8_t *plaintext,uint8_t *message,size_t messageByteLength,
        picnic_instance_t *params)

{
  size_t t;
  hash_context ctx;
  picnic_instance_t *in_stack_00000148;
  uint8_t *in_stack_00000150;
  uint16_t *in_stack_00000158;
  uint16_t *in_stack_00000160;
  size_t in_stack_fffffffffffffee8;
  uint8_t *data;
  hash_context *in_stack_fffffffffffffef0;
  
  hash_init(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  for (data = (uint8_t *)0x0; data < (uint8_t *)(ulong)*(ushort *)(ctx.sponge.state._32_8_ + 4);
      data = data + 1) {
    hash_update(in_stack_fffffffffffffef0,data,0x14732f);
  }
  hash_update(in_stack_fffffffffffffef0,data,0x14735d);
  hash_update(in_stack_fffffffffffffef0,data,0x147374);
  hash_update(in_stack_fffffffffffffef0,data,0x147394);
  hash_update(in_stack_fffffffffffffef0,data,0x1473b4);
  hash_update(in_stack_fffffffffffffef0,data,0x1473ce);
  hash_final((hash_context *)0x1473d8);
  hash_squeeze(in_stack_fffffffffffffef0,data,0x1473f8);
  expandChallenge(in_stack_00000160,in_stack_00000158,in_stack_00000150,in_stack_00000148);
  return;
}

Assistant:

static void HCP(uint8_t* sigH, uint16_t* challengeC, uint16_t* challengeP, const commitments_t* Ch,
                uint8_t* hCv, uint8_t* salt, const uint8_t* pubKey, const uint8_t* plaintext,
                const uint8_t* message, size_t messageByteLength, const picnic_instance_t* params) {
  hash_context ctx;

  assert(params->num_opened_rounds < params->num_rounds);

  hash_init(&ctx, params->digest_size);
  for (size_t t = 0; t < params->num_rounds; t++) {
    hash_update(&ctx, Ch->hashes[t], params->digest_size);
  }

  hash_update(&ctx, hCv, params->digest_size);
  hash_update(&ctx, salt, SALT_SIZE);
  hash_update(&ctx, pubKey, params->input_output_size);
  hash_update(&ctx, plaintext, params->input_output_size);
  hash_update(&ctx, message, messageByteLength);
  hash_final(&ctx);
  hash_squeeze(&ctx, sigH, params->digest_size);
  hash_clear(&ctx);
  /* parts of this hash will be published as challenge so is public anyway */
  picnic_declassify(sigH, params->digest_size);

  expandChallenge(challengeC, challengeP, sigH, params);
}